

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O0

void __thiscall xercesc_4_0::QName::setValues(QName *this,QName *qname)

{
  uint uriId;
  XMLCh *pXVar1;
  QName *qname_local;
  QName *this_local;
  
  pXVar1 = getPrefix(qname);
  setPrefix(this,pXVar1);
  pXVar1 = getLocalPart(qname);
  setLocalPart(this,pXVar1);
  uriId = getURI(qname);
  setURI(this,uriId);
  return;
}

Assistant:

void QName::setValues(const QName& qname)
{
    setPrefix(qname.getPrefix());
    setLocalPart(qname.getLocalPart());
    setURI(qname.getURI());
}